

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall duckdb::UpdateSegment::RollbackUpdate(UpdateSegment *this,UpdateInfo *info)

{
  rollback_update_function_t p_Var1;
  pointer *__ptr;
  StorageLockKey *pSVar2;
  UpdateInfo *lock;
  UpdateSegment *this_00;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  undefined1 local_58 [32];
  BufferHandle local_38;
  long local_20;
  
  this_00 = (UpdateSegment *)local_58;
  pSVar2 = (StorageLockKey *)&this->lock;
  StorageLock::GetExclusiveLock((StorageLock *)local_58);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)local_58);
  local_58._8_16_ = (undefined1  [16])GetUpdateNode(this,pSVar2,info->vector_index);
  if (local_58._8_8_ != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin
              ((UndoBufferReference *)(local_58 + 0x18),(UndoBufferPointer *)(local_58 + 8));
    p_Var1 = this->rollback_update_function;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_38.node);
    lock = info;
    (*p_Var1)((UpdateInfo *)
              ((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_38.node.ptr + 0x10))->_vptr__Sp_counted_base + local_20),info);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)local_58);
    CleanupUpdateInternal(this_00,(StorageLockKey *)lock,info);
    BufferHandle::~BufferHandle(&local_38);
  }
  if ((_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)local_58._0_8_ !=
      (_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_58._0_8_);
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

void UpdateSegment::RollbackUpdate(UpdateInfo &info) {
	// obtain an exclusive lock
	auto lock_handle = lock.GetExclusiveLock();

	// move the data from the UpdateInfo back into the base info
	auto entry = GetUpdateNode(*lock_handle, info.vector_index);
	if (!entry.IsSet()) {
		return;
	}
	auto pin = entry.Pin();
	rollback_update_function(UpdateInfo::Get(pin), info);

	// clean up the update chain
	CleanupUpdateInternal(*lock_handle, info);
}